

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

void * mi_os_page_align_areax(_Bool conservative,void *addr,size_t size,size_t *newsize)

{
  byte bVar1;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (newsize != (size_t *)0x0) {
    *newsize = 0;
  }
  if (addr == (void *)0x0 || size == 0) {
    return (void *)0x0;
  }
  uVar2 = mi_os_mem_config.page_size - (mi_os_mem_config.page_size >> 1 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar5 = size + (long)addr;
  bVar1 = (byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  if (conservative) {
    uVar2 = (long)addr + (mi_os_mem_config.page_size - 1);
    if (bVar1 < 2) {
      pvVar4 = (void *)(uVar2 & -mi_os_mem_config.page_size);
      uVar5 = -mi_os_mem_config.page_size & uVar5;
    }
    else {
      pvVar4 = (void *)(uVar2 - uVar2 % mi_os_mem_config.page_size);
      uVar5 = uVar5 - uVar5 % mi_os_mem_config.page_size;
    }
  }
  else {
    uVar5 = (mi_os_mem_config.page_size + uVar5) - 1;
    if (bVar1 < 2) {
      pvVar4 = (void *)((ulong)addr & -mi_os_mem_config.page_size);
      uVar5 = -mi_os_mem_config.page_size & uVar5;
    }
    else {
      pvVar4 = (void *)((long)addr - (ulong)addr % mi_os_mem_config.page_size);
      uVar5 = uVar5 - uVar5 % mi_os_mem_config.page_size;
    }
  }
  sVar6 = uVar5 - (long)pvVar4;
  pvVar3 = (void *)0x0;
  if (0 < (long)sVar6) {
    pvVar3 = pvVar4;
  }
  if ((newsize != (size_t *)0x0) && (0 < (long)sVar6)) {
    *newsize = sVar6;
    pvVar3 = pvVar4;
  }
  return pvVar3;
}

Assistant:

static void* mi_os_page_align_areax(bool conservative, void* addr, size_t size, size_t* newsize) {
  mi_assert(addr != NULL && size > 0);
  if (newsize != NULL) *newsize = 0;
  if (size == 0 || addr == NULL) return NULL;

  // page align conservatively within the range
  void* start = (conservative ? mi_align_up_ptr(addr, _mi_os_page_size())
    : mi_align_down_ptr(addr, _mi_os_page_size()));
  void* end = (conservative ? mi_align_down_ptr((uint8_t*)addr + size, _mi_os_page_size())
    : mi_align_up_ptr((uint8_t*)addr + size, _mi_os_page_size()));
  ptrdiff_t diff = (uint8_t*)end - (uint8_t*)start;
  if (diff <= 0) return NULL;

  mi_assert_internal((conservative && (size_t)diff <= size) || (!conservative && (size_t)diff >= size));
  if (newsize != NULL) *newsize = (size_t)diff;
  return start;
}